

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O1

void __thiscall
DCanvas::DrawLine(DCanvas *this,int x0,int y0,int x1,int y1,int palColor,uint32 realcolor)

{
  uint uVar1;
  uint uVar2;
  BYTE *pBVar3;
  uint level;
  int iVar4;
  int xx;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  if (palColor < 0) {
    palColor = PalFromRGB(realcolor);
  }
  (*(this->super_DObject)._vptr_DObject[8])(this,1);
  iVar7 = y0;
  iVar4 = x1;
  xx = x0;
  if (y1 < y0) {
    iVar7 = y1;
    iVar4 = x0;
    xx = x1;
    y1 = y0;
  }
  PUTTRANSDOT(this,xx,iVar7,palColor,0);
  uVar5 = iVar4 - xx;
  uVar1 = -uVar5;
  if (0 < (int)uVar5) {
    uVar1 = uVar5;
  }
  uVar2 = y1 - iVar7;
  if (uVar2 == 0) {
    if (x1 < x0) {
      x0 = x1;
    }
    memset(this->Buffer + (long)x0 + (long)iVar7 * (long)this->Pitch,palColor,(ulong)(uVar1 + 1));
  }
  else if (x0 == x1) {
    iVar4 = this->Pitch;
    pBVar3 = this->Buffer + (long)xx + (long)iVar7 * (long)iVar4;
    iVar7 = iVar7 - y1;
    do {
      *pBVar3 = (BYTE)palColor;
      pBVar3 = pBVar3 + iVar4;
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0);
  }
  else {
    uVar6 = (int)uVar5 >> 0x1f | 1;
    if (uVar1 == uVar2) {
      iVar4 = this->Pitch;
      pBVar3 = this->Buffer + (long)xx + (long)(iVar4 * iVar7);
      iVar7 = iVar7 - y1;
      do {
        *pBVar3 = (BYTE)palColor;
        pBVar3 = pBVar3 + (int)(uVar6 + iVar4);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0);
    }
    else {
      if ((int)uVar1 < (int)uVar2) {
        uVar1 = (uVar1 << 0x10) / uVar2 & 0xffff;
        if ((int)uVar5 < 0) {
          if (uVar2 != 1) {
            iVar7 = iVar7 + 1;
            uVar5 = 0;
            do {
              uVar5 = uVar5 + uVar1;
              uVar2 = uVar5 >> 10 & 0x3f;
              PUTTRANSDOT(this,xx - (uVar5 >> 0x10),iVar7,palColor,uVar2);
              PUTTRANSDOT(this,~(uVar5 >> 0x10) + xx,iVar7,palColor,uVar2 ^ 0x3f);
              iVar7 = iVar7 + 1;
            } while (y1 != iVar7);
          }
        }
        else if (uVar2 != 1) {
          iVar7 = iVar7 + 1;
          uVar5 = 0;
          do {
            uVar5 = uVar5 + uVar1;
            uVar2 = uVar5 >> 10 & 0x3f;
            iVar8 = (uVar5 >> 0x10) + xx;
            PUTTRANSDOT(this,iVar8,iVar7,palColor,uVar2);
            PUTTRANSDOT(this,iVar8 + uVar6,iVar7,palColor,uVar2 ^ 0x3f);
            iVar7 = iVar7 + 1;
          } while (y1 != iVar7);
        }
      }
      else {
        uVar5 = 0;
        iVar8 = uVar1 - 1;
        if (iVar8 != 0) {
          do {
            xx = xx + uVar6;
            uVar5 = uVar5 + ((uVar2 * 0x10000) / uVar1 & 0xffff);
            level = uVar5 >> 10 & 0x3f;
            PUTTRANSDOT(this,xx,(uVar5 >> 0x10) + iVar7,palColor,level);
            PUTTRANSDOT(this,xx,(uVar5 >> 0x10) + iVar7 + 1,palColor,level ^ 0x3f);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
      }
      PUTTRANSDOT(this,iVar4,y1,palColor,0);
    }
  }
  (*(this->super_DObject)._vptr_DObject[9])();
  return;
}

Assistant:

void DCanvas::DrawLine(int x0, int y0, int x1, int y1, int palColor, uint32 realcolor)
//void DrawTransWuLine (int x0, int y0, int x1, int y1, BYTE palColor)
{
	const int WeightingScale = 0;
	const int WEIGHTBITS = 6;
	const int WEIGHTSHIFT = 16-WEIGHTBITS;
	const int NUMWEIGHTS = (1<<WEIGHTBITS);
	const int WEIGHTMASK = (NUMWEIGHTS-1);

	if (palColor < 0)
	{
		palColor = PalFromRGB(realcolor);
	}

	Lock();
	int deltaX, deltaY, xDir;

	if (y0 > y1)
	{
		int temp = y0; y0 = y1; y1 = temp;
		temp = x0; x0 = x1; x1 = temp;
	}

	PUTTRANSDOT (x0, y0, palColor, 0);

	if ((deltaX = x1 - x0) >= 0)
	{
		xDir = 1;
	}
	else
	{
		xDir = -1;
		deltaX = -deltaX;
	}

	if ((deltaY = y1 - y0) == 0)
	{ // horizontal line
		if (x0 > x1)
		{
			swapvalues (x0, x1);
		}
		memset (GetBuffer() + y0*GetPitch() + x0, palColor, deltaX+1);
	}
	else if (deltaX == 0)
	{ // vertical line
		BYTE *spot = GetBuffer() + y0*GetPitch() + x0;
		int pitch = GetPitch ();
		do
		{
			*spot = palColor;
			spot += pitch;
		} while (--deltaY != 0);
	}
	else if (deltaX == deltaY)
	{ // diagonal line.
		BYTE *spot = GetBuffer() + y0*GetPitch() + x0;
		int advance = GetPitch() + xDir;
		do
		{
			*spot = palColor;
			spot += advance;
		} while (--deltaY != 0);
	}
	else
	{
		// line is not horizontal, diagonal, or vertical
		fixed_t errorAcc = 0;

		if (deltaY > deltaX)
		{ // y-major line
			fixed_t errorAdj = (((unsigned)deltaX << 16) / (unsigned)deltaY) & 0xffff;
			if (xDir < 0)
			{
				if (WeightingScale == 0)
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = (errorAcc >> WEIGHTSHIFT) & WEIGHTMASK;
						PUTTRANSDOT (x0 - (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 - (errorAcc >> 16) - 1, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
				else
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = ((errorAcc * WeightingScale) >> (WEIGHTSHIFT+8)) & WEIGHTMASK;
						PUTTRANSDOT (x0 - (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 - (errorAcc >> 16) - 1, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
			}
			else
			{
				if (WeightingScale == 0)
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = (errorAcc >> WEIGHTSHIFT) & WEIGHTMASK;
						PUTTRANSDOT (x0 + (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 + (errorAcc >> 16) + xDir, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
				else
				{
					while (--deltaY)
					{
						errorAcc += errorAdj;
						y0++;
						int weighting = ((errorAcc * WeightingScale) >> (WEIGHTSHIFT+8)) & WEIGHTMASK;
						PUTTRANSDOT (x0 + (errorAcc >> 16), y0, palColor, weighting);
						PUTTRANSDOT (x0 + (errorAcc >> 16) + xDir, y0,
								palColor, WEIGHTMASK - weighting);
					}
				}
			}
		}
		else
		{ // x-major line
			fixed_t errorAdj = (((DWORD) deltaY << 16) / (DWORD) deltaX) & 0xffff;

			if (WeightingScale == 0)
			{
				while (--deltaX)
				{
					errorAcc += errorAdj;
					x0 += xDir;
					int weighting = (errorAcc >> WEIGHTSHIFT) & WEIGHTMASK;
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16), palColor, weighting);
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16) + 1,
							palColor, WEIGHTMASK - weighting);
				}
			}
			else
			{
				while (--deltaX)
				{
					errorAcc += errorAdj;
					x0 += xDir;
					int weighting = ((errorAcc * WeightingScale) >> (WEIGHTSHIFT+8)) & WEIGHTMASK;
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16), palColor, weighting);
					PUTTRANSDOT (x0, y0 + (errorAcc >> 16) + 1,
							palColor, WEIGHTMASK - weighting);
				}
			}
		}
		PUTTRANSDOT (x1, y1, palColor, 0);
	}
	Unlock();
}